

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

Session * FIX::Session::lookupSession(string *string,bool reverse)

{
  Header *this;
  bool bVar1;
  FieldBase *pFVar2;
  FieldBase *pFVar3;
  FieldBase *pFVar4;
  Session *pSVar5;
  allocator<char> local_399;
  string local_398;
  FieldBase local_378;
  FieldBase local_320;
  SessionID local_2c8;
  Message message;
  
  Message::Message(&message);
  bVar1 = Message::setStringHeader(&message,string);
  if (bVar1) {
    this = &message.m_header;
    pFVar2 = FieldMap::getFieldRef(&this->super_FieldMap,8);
    pFVar3 = FieldMap::getFieldRef(&this->super_FieldMap,0x31);
    pFVar4 = FieldMap::getFieldRef(&this->super_FieldMap,0x38);
    if (reverse) {
      SenderCompID::SenderCompID((SenderCompID *)&local_378,&pFVar4->m_string);
      TargetCompID::TargetCompID((TargetCompID *)&local_320,&pFVar3->m_string);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_399);
      SessionID::SessionID
                (&local_2c8,&pFVar2->m_string,&local_378.m_string,&local_320.m_string,&local_398);
      pSVar5 = lookupSession(&local_2c8);
      SessionID::~SessionID(&local_2c8);
      std::__cxx11::string::~string((string *)&local_398);
      FieldBase::~FieldBase(&local_320);
      FieldBase::~FieldBase(&local_378);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"",(allocator<char> *)&local_320);
      SessionID::SessionID
                (&local_2c8,&pFVar2->m_string,&pFVar3->m_string,&pFVar4->m_string,
                 (string *)&local_378);
      pSVar5 = lookupSession(&local_2c8);
      SessionID::~SessionID(&local_2c8);
      std::__cxx11::string::~string((string *)&local_378);
    }
  }
  else {
    pSVar5 = (Session *)0x0;
  }
  Message::~Message(&message);
  return pSVar5;
}

Assistant:

Session *Session::lookupSession(const std::string &string, bool reverse) {
  Message message;
  if (!message.setStringHeader(string)) {
    return nullptr;
  }

  try {
    const Header &header = message.getHeader();
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);

    if (reverse) {
      return lookupSession(SessionID(beginString, SenderCompID(targetCompID), TargetCompID(senderCompID)));
    }

    return lookupSession(SessionID(beginString, senderCompID, targetCompID));
  } catch (FieldNotFound &) {
    return nullptr;
  }
}